

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void nn_hash_init(nn_hash *self)

{
  undefined8 *puVar1;
  nn_list *pnVar2;
  long lVar3;
  
  self->slots = 0x20;
  self->items = 0;
  pnVar2 = (nn_list *)malloc(0x200);
  self->array = pnVar2;
  if (pnVar2 != (nn_list *)0x0) {
    lVar3 = 0;
    do {
      puVar1 = (undefined8 *)((long)&self->array->first + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x200);
    return;
  }
  nn_hash_init_cold_1();
}

Assistant:

void nn_hash_init (struct nn_hash *self)
{
    uint32_t i;

    self->slots = NN_HASH_INITIAL_SLOTS;
    self->items = 0;
    self->array = nn_alloc (sizeof (struct nn_list) * NN_HASH_INITIAL_SLOTS,
        "hash map");
    alloc_assert (self->array);
    for (i = 0; i != NN_HASH_INITIAL_SLOTS; ++i)
        nn_list_init (&self->array [i]);
}